

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

HRESULT __thiscall
JsrtDebugManager::DbgRegisterFunction
          (JsrtDebugManager *this,ScriptContext *scriptContext,FunctionBody *functionBody,
          DWORD_PTR dwDebugSourceContext,LPCWSTR title)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *alloc;
  DebugDocument *this_00;
  DebugContext *this_01;
  DynamicObject *object;
  DynamicObject *eventDataObject;
  JsrtDebugEventObject debugEventObject;
  TrackAllocData local_70;
  DebugDocument *local_48;
  DebugDocument *debugDocument;
  JsrtDebugDocumentManager *debugDocumentManager;
  Utf8SourceInfo *utf8SourceInfo;
  LPCWSTR title_local;
  DWORD_PTR dwDebugSourceContext_local;
  FunctionBody *functionBody_local;
  ScriptContext *scriptContext_local;
  JsrtDebugManager *this_local;
  
  utf8SourceInfo = (Utf8SourceInfo *)title;
  title_local = (LPCWSTR)dwDebugSourceContext;
  dwDebugSourceContext_local = (DWORD_PTR)functionBody;
  functionBody_local = (FunctionBody *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  debugDocumentManager =
       (JsrtDebugDocumentManager *)
       Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)functionBody);
  bVar2 = Js::Utf8SourceInfo::GetIsLibraryCode((Utf8SourceInfo *)debugDocumentManager);
  if ((!bVar2) &&
     (bVar2 = Js::Utf8SourceInfo::HasDebugDocument((Utf8SourceInfo *)debugDocumentManager), !bVar2))
  {
    debugDocument = (DebugDocument *)GetDebugDocumentManager(this);
    if (debugDocument == (DebugDocument *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                         ,0x98,"(debugDocumentManager != nullptr)","debugDocumentManager != nullptr"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_70,(type_info *)&Js::DebugDocument::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
               ,0x9a);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_70);
    debugEventObject.scriptContext = (ScriptContext *)Memory::HeapAllocator::NoThrowAlloc;
    this_00 = (DebugDocument *)new<Memory::HeapAllocator>(0x20,alloc,true,0x469be0);
    Js::DebugDocument::DebugDocument
              (this_00,(Utf8SourceInfo *)debugDocumentManager,
               (FunctionBody *)dwDebugSourceContext_local);
    local_48 = this_00;
    if (this_00 != (DebugDocument *)0x0) {
      Js::Utf8SourceInfo::SetDebugDocument((Utf8SourceInfo *)debugDocumentManager,this_00);
    }
    if (this->debugEventCallback != (JsDiagDebugEventCallback)0x0) {
      this_01 = Js::ScriptContext::GetDebugContext((ScriptContext *)functionBody_local);
      bVar2 = Js::DebugContext::GetIsReparsingSource(this_01);
      if (!bVar2) {
        JsrtDebugEventObject::JsrtDebugEventObject
                  ((JsrtDebugEventObject *)&eventDataObject,(ScriptContext *)functionBody_local);
        object = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)&eventDataObject);
        JsrtDebugUtils::AddSourceMetadataToObject(object,(Utf8SourceInfo *)debugDocumentManager);
        CallDebugEventCallback
                  (this,JsDiagDebugEventSourceCompile,object,(ScriptContext *)functionBody_local,
                   false);
        JsrtDebugEventObject::~JsrtDebugEventObject((JsrtDebugEventObject *)&eventDataObject);
      }
    }
  }
  return 0;
}

Assistant:

HRESULT JsrtDebugManager::DbgRegisterFunction(Js::ScriptContext* scriptContext, Js::FunctionBody* functionBody, DWORD_PTR dwDebugSourceContext, LPCWSTR title)
{
    Js::Utf8SourceInfo* utf8SourceInfo = functionBody->GetUtf8SourceInfo();

    if (!utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->HasDebugDocument())
    {
        JsrtDebugDocumentManager* debugDocumentManager = this->GetDebugDocumentManager();
        Assert(debugDocumentManager != nullptr);

        Js::DebugDocument* debugDocument = HeapNewNoThrow(Js::DebugDocument, utf8SourceInfo, functionBody);
        if (debugDocument != nullptr)
        {
            utf8SourceInfo->SetDebugDocument(debugDocument);
        }

        // Raising events during the middle of a source reparse allows the host to reenter the
        // script context and cause memory race conditions. Suppressing these events during a
        // reparse prevents the issue. Since the host was already expected to call JsDiagGetScripts
        // once the attach is completed to get the list of parsed scripts, there is no change in
        // behavior.
        if (this->debugEventCallback != nullptr &&
            !scriptContext->GetDebugContext()->GetIsReparsingSource())
        {
            JsrtDebugEventObject debugEventObject(scriptContext);
            Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();
            JsrtDebugUtils::AddSourceMetadataToObject(eventDataObject, utf8SourceInfo);

            this->CallDebugEventCallback(JsDiagDebugEventSourceCompile, eventDataObject, scriptContext, false /*isBreak*/);
        }
    }

    return S_OK;
}